

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O1

int archive_write_ar_close(archive_write *a)

{
  int iVar1;
  
  if (*(char *)((long)a->format_data + 0x18) != '\0') {
    return 0;
  }
  *(undefined1 *)((long)a->format_data + 0x18) = 1;
  iVar1 = __archive_write_output(a,"!<arch>\n",8);
  return iVar1;
}

Assistant:

static int
archive_write_ar_close(struct archive_write *a)
{
	struct ar_w *ar;
	int ret;

	/*
	 * If we haven't written anything yet, we need to write
	 * the ar global header now to make it a valid ar archive.
	 */
	ar = (struct ar_w *)a->format_data;
	if (!ar->wrote_global_header) {
		ar->wrote_global_header = 1;
		ret = __archive_write_output(a, "!<arch>\n", 8);
		return (ret);
	}

	return (ARCHIVE_OK);
}